

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::die(Parser *this,string *where,string *message,Token *token)

{
  ostream *poVar1;
  Token *token_local;
  string *message_local;
  string *where_local;
  Parser *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)where);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Token::print(token);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "\nThe following is a list of tokens that have been identified up to this point.\n"
                 );
  Tokenizer::printProcessedTokens(this->tokenizer);
  exit(1);
}

Assistant:

void Parser::die(std::string where, std::string message, Token &token) {
    std::cout << where << " " << message << std::endl;
    token.print();
    std::cout << std::endl;
    std::cout << "\nThe following is a list of tokens that have been identified up to this point.\n";
    tokenizer.printProcessedTokens();
    exit(1);
}